

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O0

void Mio_LibraryDetectSpecialGates(Mio_Library_t *pLib)

{
  Mio_Gate_t *pMVar1;
  word uFuncOr2;
  word uFuncNor2;
  word uFuncAnd2;
  word uFuncNand2;
  word uFuncInv;
  word uFuncBuf;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  
  Mio_LibrarySortGates(pLib);
  for (uFuncBuf = (word)Mio_LibraryReadGates(pLib); uFuncBuf != 0;
      uFuncBuf = (word)Mio_GateReadNext((Mio_Gate_t *)uFuncBuf)) {
    pMVar1 = Mio_GateCompare(pLib->pGateBuf,(Mio_Gate_t *)uFuncBuf,0xaaaaaaaaaaaaaaaa);
    pLib->pGateBuf = pMVar1;
  }
  if (pLib->pGateBuf == (Mio_Gate_t *)0x0) {
    printf("Warnings: genlib library reader cannot detect the buffer gate.\n");
    printf("Some parts of the supergate-based technology mapper may not work correctly.\n");
  }
  for (uFuncBuf = (word)Mio_LibraryReadGates(pLib); uFuncBuf != 0;
      uFuncBuf = (word)Mio_GateReadNext((Mio_Gate_t *)uFuncBuf)) {
    pMVar1 = Mio_GateCompare(pLib->pGateInv,(Mio_Gate_t *)uFuncBuf,0x5555555555555555);
    pLib->pGateInv = pMVar1;
  }
  if (pLib->pGateInv == (Mio_Gate_t *)0x0) {
    printf("Warnings: genlib library reader cannot detect the invertor gate.\n");
    printf("Some parts of the supergate-based technology mapper may not work correctly.\n");
  }
  for (uFuncBuf = (word)Mio_LibraryReadGates(pLib); uFuncBuf != 0;
      uFuncBuf = (word)Mio_GateReadNext((Mio_Gate_t *)uFuncBuf)) {
    pMVar1 = Mio_GateCompare(pLib->pGateNand2,(Mio_Gate_t *)uFuncBuf,0x7777777777777777);
    pLib->pGateNand2 = pMVar1;
    pMVar1 = Mio_GateCompare(pLib->pGateAnd2,(Mio_Gate_t *)uFuncBuf,0x8888888888888888);
    pLib->pGateAnd2 = pMVar1;
    pMVar1 = Mio_GateCompare(pLib->pGateNor2,(Mio_Gate_t *)uFuncBuf,0x1111111111111111);
    pLib->pGateNor2 = pMVar1;
    pMVar1 = Mio_GateCompare(pLib->pGateOr2,(Mio_Gate_t *)uFuncBuf,0xeeeeeeeeeeeeeeee);
    pLib->pGateOr2 = pMVar1;
  }
  if ((((pLib->pGateAnd2 == (Mio_Gate_t *)0x0) && (pLib->pGateNand2 == (Mio_Gate_t *)0x0)) &&
      (pLib->pGateNor2 == (Mio_Gate_t *)0x0)) && (pLib->pGateOr2 == (Mio_Gate_t *)0x0)) {
    printf("Warnings: genlib library reader cannot detect the AND2, NAND2, OR2, and NOR2 gate.\n");
    printf("Some parts of the supergate-based technology mapper may not work correctly.\n");
  }
  return;
}

Assistant:

void Mio_LibraryDetectSpecialGates( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    word uFuncBuf, uFuncInv, uFuncNand2, uFuncAnd2, uFuncNor2, uFuncOr2;

    Mio_LibrarySortGates( pLib );

    uFuncBuf   = ABC_CONST(0xAAAAAAAAAAAAAAAA);
    uFuncAnd2  = ABC_CONST(0xAAAAAAAAAAAAAAAA) & ABC_CONST(0xCCCCCCCCCCCCCCCC);
    uFuncOr2   = ABC_CONST(0xAAAAAAAAAAAAAAAA) | ABC_CONST(0xCCCCCCCCCCCCCCCC);
    uFuncInv   = ~uFuncBuf;
    uFuncNand2 = ~uFuncAnd2;
    uFuncNor2  = ~uFuncOr2;

    // get smallest-area buffer
    Mio_LibraryForEachGate( pLib, pGate )
        pLib->pGateBuf = Mio_GateCompare( pLib->pGateBuf, pGate, uFuncBuf );
    if ( pLib->pGateBuf == NULL )
    {
        printf( "Warnings: genlib library reader cannot detect the buffer gate.\n" );
        printf( "Some parts of the supergate-based technology mapper may not work correctly.\n" );
    }
 
    // get smallest-area inverter
    Mio_LibraryForEachGate( pLib, pGate )
        pLib->pGateInv = Mio_GateCompare( pLib->pGateInv, pGate, uFuncInv );
    if ( pLib->pGateInv == NULL )
    {
        printf( "Warnings: genlib library reader cannot detect the invertor gate.\n" );
        printf( "Some parts of the supergate-based technology mapper may not work correctly.\n" );
    }

    // get smallest-area NAND2/AND2 gates
    Mio_LibraryForEachGate( pLib, pGate )
    {
        pLib->pGateNand2 = Mio_GateCompare( pLib->pGateNand2, pGate, uFuncNand2 );
        pLib->pGateAnd2 = Mio_GateCompare( pLib->pGateAnd2, pGate, uFuncAnd2 );
        pLib->pGateNor2 = Mio_GateCompare( pLib->pGateNor2, pGate, uFuncNor2 );
        pLib->pGateOr2 = Mio_GateCompare( pLib->pGateOr2, pGate, uFuncOr2 );
    }
    if ( pLib->pGateAnd2 == NULL && pLib->pGateNand2 == NULL && pLib->pGateNor2 == NULL && pLib->pGateOr2 == NULL )
    {
        printf( "Warnings: genlib library reader cannot detect the AND2, NAND2, OR2, and NOR2 gate.\n" );
        printf( "Some parts of the supergate-based technology mapper may not work correctly.\n" );
    }
}